

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O2

void soul::ASTUtilities::resolveHoistedEndpoints(Allocator *allocator,ModuleBase *module)

{
  bool bVar1;
  int iVar2;
  Graph *in_RAX;
  undefined4 extraout_var;
  Graph *g;
  undefined8 *extraout_RDX;
  pool_ref<soul::AST::ModuleBase> *m;
  pool_ptr<soul::AST::Graph> graph;
  pool_ptr<soul::AST::Graph> local_28;
  undefined8 *puVar3;
  
  local_28.object = in_RAX;
  iVar2 = (*(module->super_Scope)._vptr_Scope[0x11])(&module->super_Scope);
  for (puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar2); puVar3 != extraout_RDX;
      puVar3 = puVar3 + 1) {
    resolveHoistedEndpoints(allocator,(ModuleBase *)*puVar3);
  }
  cast<soul::AST::Graph,soul::AST::ModuleBase>((soul *)&local_28,module);
  if (local_28.object != (Graph *)0x0) {
    do {
      g = pool_ptr<soul::AST::Graph>::operator*(&local_28);
      bVar1 = hoistFirstChildEndpoint(allocator,g);
    } while (bVar1);
  }
  return;
}

Assistant:

static void resolveHoistedEndpoints (AST::Allocator& allocator, AST::ModuleBase& module)
    {
        for (auto& m : module.getSubModules())
            resolveHoistedEndpoints (allocator, m);

        if (auto graph = cast<AST::Graph> (module))
        {
            while (hoistFirstChildEndpoint (allocator, *graph))
            {}
        }
    }